

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_hook.h
# Opt level: O2

void __thiscall
absl::base_internal::
AtomicHook<void_(*)(const_char_*,_int,_const_char_*,_const_char_*,_const_char_*)>::Store
          (AtomicHook<void_(*)(const_char_*,_int,_const_char_*,_const_char_*,_const_char_*)> *this,
          FnPtr fn)

{
  bool bVar1;
  
  bVar1 = DoStore(this,fn);
  if (bVar1) {
    return;
  }
  __assert_fail("success",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/base/internal/atomic_hook.h"
                ,0x6e,
                "void absl::base_internal::AtomicHook<void (*)(const char *, int, const char *, const char *, const char *)>::Store(FnPtr) [T = void (*)(const char *, int, const char *, const char *, const char *)]"
               );
}

Assistant:

void Store(FnPtr fn) {
    bool success = DoStore(fn);
    static_cast<void>(success);
    assert(success);
  }